

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  iterator l;
  bool bVar1;
  long lVar2;
  long lVar3;
  pointer ppVar4;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  char *pcVar5;
  long lVar6;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb58;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb60;
  pointer this_03;
  AssertHelper *this_04;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb68;
  pointer lhs;
  uint *lhs_00;
  char *in_stack_fffffffffffffb70;
  char *in_stack_fffffffffffffb78;
  int iVar7;
  char *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  Type type;
  AssertHelper *in_stack_fffffffffffffb90;
  key_type *in_stack_fffffffffffffb98;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffbb8;
  pointer in_stack_fffffffffffffbc0;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbd0;
  AssertionResult *in_stack_fffffffffffffbd8;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  pointer in_stack_fffffffffffffbf0;
  AssertionResult local_3b0;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined8 local_368;
  AssertHelper *local_360;
  uint *local_358;
  undefined8 local_348;
  AssertHelper *local_340;
  uint *local_338;
  size_type local_320;
  undefined4 local_314;
  AssertionResult local_310 [3];
  value_type local_2d4;
  int local_2cc;
  size_type local_2b8;
  undefined4 local_2ac;
  AssertionResult local_2a8;
  HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_298;
  pointer local_290;
  pointer local_288;
  string local_280 [48];
  const_iterator local_250;
  undefined1 local_229;
  AssertionResult local_228;
  key_type local_218;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_210 [2];
  size_type local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0 [2];
  key_type local_1b0;
  size_type local_1a8;
  undefined4 local_19c;
  AssertionResult local_198 [2];
  size_type local_178;
  undefined4 local_16c;
  AssertionResult local_168 [2];
  key_type local_148;
  size_type local_140;
  undefined4 local_134;
  AssertionResult local_130 [2];
  size_type local_110;
  undefined4 local_104;
  AssertionResult local_100 [2];
  key_type local_e0;
  size_type local_d8;
  undefined4 local_cc;
  AssertionResult local_c8 [3];
  value_type local_90;
  value_type local_60;
  key_type local_38;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  local_24 = 0;
  local_38 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb2885);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb28e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb2959);
  lVar2 = in_RDI + 0x10;
  local_60 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb58,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  lVar3 = in_RDI + 0x10;
  local_90 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb58,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbe0,(value_type *)in_stack_fffffffffffffbd8);
  local_cc = 1;
  ppVar4 = (pointer)(in_RDI + 0x10);
  local_e0 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  local_d8 = google::
             BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbf0 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xeb2aa7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb2b0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb2b78);
  local_104 = 1;
  local_110 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb2b94);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbe8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb2c0d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbe0,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb2c70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb2ce1);
  local_134 = 0;
  this_00 = (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_148 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20))
  ;
  local_140 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbd8 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0xeb2da3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb2e06);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb2e74);
  local_16c = 1;
  local_178 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb2e90);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbd0 =
         (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xeb2f09);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb2f66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb2fd7);
  local_19c = 0;
  pcVar5 = (char *)(in_RDI + 0x10);
  local_1b0 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20))
  ;
  local_1a8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb60,(key_type *)in_stack_fffffffffffffb58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbc0 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xeb3093);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb30f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb315e);
  local_1d4 = 1;
  local_1e0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb317a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)in_stack_fffffffffffffb60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    in_stack_fffffffffffffbb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb31f3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    testing::Message::~Message((Message *)0xeb3250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb32c1);
  lVar6 = in_RDI + 0x10;
  local_218 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffba0);
  local_229 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(local_210,&local_250);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb60,(bool *)in_stack_fffffffffffffb58,
             (type *)0xeb3351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0,pcVar5,
               (char *)in_stack_fffffffffffffbc0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(local_280);
    testing::Message::~Message((Message *)0xeb3424);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb34bb);
  local_298 = (HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_210[0].ht;
  local_290 = local_210[0].pos;
  local_288 = local_210[0].end;
  it_00.pos = (pointer)in_stack_fffffffffffffbb8;
  it_00.ht = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)lVar6;
  it_00.end = in_stack_fffffffffffffbc0;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffba0,it_00);
  local_2ac = 0;
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb3539);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)local_210[0].end,
             (unsigned_long *)local_210[0].pos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
  this_02 = (HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_210[0].ht;
  this_03 = local_210[0].pos;
  lhs = local_210[0].end;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb35b2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,(Type)((ulong)in_stack_fffffffffffffb88 >> 0x20),
               in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210[0].pos);
    testing::Message::~Message((Message *)0xeb360f);
    this_02 = (HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_210[0].ht;
    this_03 = local_210[0].pos;
    lhs = local_210[0].end;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb367d);
  for (local_2cc = 10; type = (Type)((ulong)in_stack_fffffffffffffb88 >> 0x20), local_2cc < 100;
      local_2cc = local_2cc + 1) {
    in_stack_fffffffffffffba0 =
         (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)(in_RDI + 0x10);
    local_2d4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_02,0);
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(this_00,(value_type *)in_stack_fffffffffffffbd8);
  }
  local_314 = 0x5a;
  local_320 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb3715);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,(uint *)lhs,
             (unsigned_long *)this_03);
  iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb90);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb377c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb90,type,in_stack_fffffffffffffb80,iVar7,
               in_stack_fffffffffffffb70);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xeb37d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb384a);
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffba0);
  local_348 = local_368;
  local_340 = local_360;
  local_338 = local_358;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffba0);
  local_380 = local_3a0;
  local_378 = local_398;
  local_370 = local_390;
  f.pos = (pointer)in_stack_fffffffffffffbe8;
  f.ht = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)this_00;
  f.end = in_stack_fffffffffffffbf0;
  l.pos = (pointer)lVar3;
  l.ht = (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)lVar2;
  l.end = ppVar4;
  this_04 = local_340;
  lhs_00 = local_338;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbd0,f,l);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xeb3951);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_398,local_3a0,lhs_00,(unsigned_long *)this_04);
  iVar7 = (int)((ulong)local_398 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xeb39ca);
    testing::internal::AssertHelper::AssertHelper
              (this_01,(Type)((ulong)pcVar5 >> 0x20),local_390,iVar7,local_3a0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffbd8);
    testing::internal::AssertHelper::~AssertHelper(this_04);
    testing::Message::~Message((Message *)0xeb3a27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb3a92);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}